

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

char * __thiscall
fmt::v7::detail::utf8_to_utf16::utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *p)

{
  buffer<wchar_t> *this_00;
  uint32_t uVar1;
  char *pcVar2;
  runtime_error *this_01;
  int local_34;
  uint32_t local_30;
  int error;
  
  this_00 = (buffer<wchar_t> *)this->this;
  local_30 = 0;
  local_34 = 0;
  pcVar2 = utf8_decode(p,&local_30,&local_34);
  uVar1 = local_30;
  if (local_34 == 0) {
    if (local_30 < 0x10000) {
      error = local_30;
    }
    else {
      error = (local_30 - 0x10000 >> 10) + 0xd800;
      buffer<wchar_t>::push_back(this_00,&error);
      error = uVar1 & 0x3ff | 0xdc00;
    }
    buffer<wchar_t>::push_back(this_00,&error);
    return pcVar2;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"invalid utf8");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}